

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<unsigned_long,_true> *ret)

{
  undefined6 in_register_00000032;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  (**(code **)(*(long *)this + 0x10))(this,CONCAT62(in_register_00000032,field_id));
  Read<duckdb::vector<unsigned_long,true>>((type *)&local_30,this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,&local_30);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
  (**(code **)(*(long *)this + 0x18))(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}